

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void page_ref(Page *pPage)

{
  Page *pPage_local;
  
  if ((pPage->pPager->pAllocator->pMutexMethods != (SyMutexMethods *)0x0) &&
     (pPage->pPager->pAllocator->pMutex != (SyMutex *)0x0)) {
    (*pPage->pPager->pAllocator->pMutexMethods->xEnter)(pPage->pPager->pAllocator->pMutex);
  }
  pPage->nRef = pPage->nRef + 1;
  if ((pPage->pPager->pAllocator->pMutexMethods != (SyMutexMethods *)0x0) &&
     (pPage->pPager->pAllocator->pMutex != (SyMutex *)0x0)) {
    (*pPage->pPager->pAllocator->pMutexMethods->xLeave)(pPage->pPager->pAllocator->pMutex);
  }
  return;
}

Assistant:

static void page_ref(Page *pPage)
{
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexEnter(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
	pPage->nRef++;
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexLeave(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
}